

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::EventImport,_std::default_delete<wabt::EventImport>_>
wabt::MakeUnique<wabt::EventImport>(void)

{
  EventImport *this;
  __uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true> in_RDI;
  
  this = (EventImport *)operator_new(0xf0);
  EventImport::EventImport(this,(string_view)ZEXT816(0));
  *(EventImport **)
   in_RDI.super___uniq_ptr_impl<wabt::EventImport,_std::default_delete<wabt::EventImport>_>._M_t.
   super__Tuple_impl<0UL,_wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>.
   super__Head_base<0UL,_wabt::EventImport_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::EventImport,_std::default_delete<wabt::EventImport>,_true,_true>)
         (tuple<wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>)
         in_RDI.super___uniq_ptr_impl<wabt::EventImport,_std::default_delete<wabt::EventImport>_>.
         _M_t.super__Tuple_impl<0UL,_wabt::EventImport_*,_std::default_delete<wabt::EventImport>_>.
         super__Head_base<0UL,_wabt::EventImport_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}